

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

int64_t absl::lts_20250127::anon_unknown_1::IDivSlowPath
                  (bool satq,Duration num,Duration den,Duration *rem)

{
  HiRep this;
  ulong uVar1;
  undefined1 is_neg;
  HiRep this_00;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint128 lhs;
  uint128 uVar7;
  uint128 lhs_00;
  Duration DVar8;
  Duration DVar9;
  uint128 u128;
  Duration d;
  Duration d_00;
  uint64_t uVar2;
  
  uVar3 = den.rep_lo_;
  this = den.rep_hi_;
  DVar8.rep_lo_ = num.rep_lo_;
  this_00 = num.rep_hi_;
  uVar4 = (ulong)this ^ (ulong)this_00;
  if ((DVar8.rep_lo_ == 0xffffffff) || (this == (HiRep)0x0 && uVar3 == 0)) {
    if ((long)this_00 < 0) {
      d_00.rep_lo_ = DVar8.rep_lo_;
      d_00.rep_hi_.lo_ = 0xffffffff;
      d_00.rep_hi_.hi_ = 0xffffffff;
      DVar9 = operator-((lts_20250127 *)0x7fffffffffffffff,d_00);
    }
    else {
      DVar9.rep_lo_ = 0xffffffff;
      DVar9.rep_hi_.lo_ = 0xffffffff;
      DVar9.rep_hi_.hi_ = 0x7fffffff;
    }
    uVar6 = 0x8000000000000000;
    *rem = DVar9;
    if (-1 < (long)uVar4) {
      uVar6 = 0x7fffffffffffffff;
    }
  }
  else if (uVar3 == 0xffffffff) {
    rem->rep_hi_ = this_00;
    rem->rep_lo_ = DVar8.rep_lo_;
    uVar6 = 0;
  }
  else {
    DVar8.rep_hi_.hi_ = 0;
    DVar8.rep_hi_.lo_ = DVar8.rep_lo_;
    lhs = MakeU128Ticks((anon_unknown_1 *)this_00,DVar8);
    d.rep_hi_.hi_ = 0;
    d.rep_hi_.lo_ = uVar3;
    d.rep_lo_ = (uint32_t)lhs.hi_;
    uVar7 = MakeU128Ticks((anon_unknown_1 *)this,d);
    is_neg = (undefined1)uVar7.hi_;
    lhs_00 = operator/(lhs,uVar7);
    uVar2 = lhs_00.hi_;
    uVar6 = lhs_00.lo_;
    if (satq) {
      uVar1 = 0x8000000000000000;
      if (-1 < (long)uVar4) {
        uVar1 = 0x7fffffffffffffff;
      }
      uVar5 = uVar6;
      if ((long)uVar6 < 0 || uVar2 != 0) {
        uVar5 = uVar1;
      }
      lhs_00.hi_ = uVar2;
      lhs_00.lo_ = uVar5;
      if ((long)uVar6 < 0 || uVar2 != 0) {
        lhs_00.hi_ = 0;
      }
    }
    uVar6 = lhs_00.lo_;
    uVar7 = operator*(lhs_00,uVar7);
    u128.hi_ = (ulong)this_00 >> 0x3f;
    u128.lo_ = SUB168((undefined1  [16])lhs - (undefined1  [16])uVar7,8);
    DVar8 = MakeDurationFromU128
                      (SUB168((undefined1  [16])lhs - (undefined1  [16])uVar7,0),u128,(bool)is_neg);
    *rem = DVar8;
    if (((long)uVar4 < 0) && (lhs_00.hi_ != 0 || uVar6 != 0)) {
      uVar6 = -uVar6 | 0x8000000000000000;
    }
    else {
      uVar6 = uVar6 & 0x7fffffffffffffff;
    }
  }
  return uVar6;
}

Assistant:

int64_t IDivSlowPath(bool satq, const Duration num, const Duration den,
                     Duration* rem) {
  const bool num_neg = num < ZeroDuration();
  const bool den_neg = den < ZeroDuration();
  const bool quotient_neg = num_neg != den_neg;

  if (time_internal::IsInfiniteDuration(num) || den == ZeroDuration()) {
    *rem = num_neg ? -InfiniteDuration() : InfiniteDuration();
    return quotient_neg ? kint64min : kint64max;
  }
  if (time_internal::IsInfiniteDuration(den)) {
    *rem = num;
    return 0;
  }

  const uint128 a = MakeU128Ticks(num);
  const uint128 b = MakeU128Ticks(den);
  uint128 quotient128 = a / b;

  if (satq) {
    // Limits the quotient to the range of int64_t.
    if (quotient128 > uint128(static_cast<uint64_t>(kint64max))) {
      quotient128 = quotient_neg ? uint128(static_cast<uint64_t>(kint64min))
                                 : uint128(static_cast<uint64_t>(kint64max));
    }
  }

  const uint128 remainder128 = a - quotient128 * b;
  *rem = MakeDurationFromU128(remainder128, num_neg);

  if (!quotient_neg || quotient128 == 0) {
    return Uint128Low64(quotient128) & kint64max;
  }
  // The quotient needs to be negated, but we need to carefully handle
  // quotient128s with the top bit on.
  return -static_cast<int64_t>(Uint128Low64(quotient128 - 1) & kint64max) - 1;
}